

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int count_cols(MATRIX *matrix,int n,int j)

{
  int iVar1;
  long lVar2;
  pointer pvVar3;
  
  pvVar3 = (matrix->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(matrix->
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3;
  if (lVar2 != 0) {
    lVar2 = (lVar2 >> 3) * -0x5555555555555555;
    lVar2 = lVar2 + (ulong)(lVar2 == 0);
    iVar1 = 0;
    do {
      iVar1 = iVar1 + (uint)(*(int *)(*(long *)&(pvVar3->
                                                super__Vector_base<int,_std::allocator<int>_>).
                                                _M_impl.super__Vector_impl_data + (long)j * 4) == n)
      ;
      pvVar3 = pvVar3 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    return iVar1;
  }
  return 0;
}

Assistant:

int count_cols(MATRIX &matrix, int n, int j){
    int n_columns=0;
    for(int i=0; i<matrix.size(); i++){
        if (matrix[i][j]==n){
            n_columns++;
        }
    }
    return n_columns;
}